

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

void __thiscall Potassco::AspifTextOutput::Data::convertToOutput(Data *this,StringMapNode node)

{
  pointer *ppppVar1;
  char *pcVar2;
  iterator __position;
  ulong uVar3;
  uint32_t data [4];
  undefined1 local_18 [8];
  StringMapNode node_local;
  
  uVar3 = (ulong)node->second;
  if ((uVar3 != 0) &&
     (uVar3 < (ulong)((long)(this->atoms).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->atoms).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3))) {
    pcVar2 = (node->first)._M_dataplus._M_p;
    node_local = node;
    if (*pcVar2 == '&') {
      fail(-2,"void Potassco::AspifTextOutput::Data::convertToOutput(StringMapNode)",0x149,
           "node->first[0] != \'&\'","Redefinition: theory atom \'%u\' already defined as \'%s\'",
           uVar3,pcVar2,0);
    }
    setGenName(this,node->second);
    data[0] = 4;
    __position._M_current =
         (this->out).
         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    data[1] = (uint32_t)
              ((ulong)((long)__position._M_current -
                      (long)(this->out).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    data[2] = 1;
    data[3] = node_local->second;
    node_local->second = 0;
    if (__position._M_current ==
        (this->out).
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
      ::_M_realloc_insert<std::pair<std::__cxx11::string_const,unsigned_int>*const&>
                ((vector<std::pair<std::__cxx11::string_const,unsigned_int>*,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>*>>
                  *)&this->out,__position,&node_local);
    }
    else {
      *__position._M_current = node_local;
      ppppVar1 = &(this->out).
                  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppppVar1 = *ppppVar1 + 1;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,
               (this->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,data,local_18);
  }
  return;
}

Assistant:

void convertToOutput(StringMapNode node) {
		if (node->second && node->second < atoms.size()) {
			POTASSCO_REQUIRE(node->first[0] != '&', "Redefinition: theory atom '%u' already defined as '%s'", node->second, node->first.c_str());
			setGenName(node->second);
			uint32_t data[4] = {static_cast<uint32_t>(Directive_t::Output), static_cast<uint32_t>(out.size()), 1, node->second};
			node->second = 0;
			out.push_back(node);
			directives.insert(directives.end(), data, data + 4);
		}
	}